

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O1

void (anonymous_namespace)::DepGraphFormatter::
     Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>
               (VectorWriter *s,DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph)

{
  uint uVar1;
  pointer pEVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer __first;
  pointer __last;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *in_RCX;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __i;
  long lVar11;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last_00;
  unsigned_long uVar12;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar13;
  DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *pDVar14;
  long in_FS_OFFSET;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  ClusterIndex idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rebuilt_order;
  vector<unsigned_int,_std::allocator<unsigned_int>_> topo_order;
  uint local_6c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,
             ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
             (allocator_type *)&local_68);
  __last = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar6 = _DAT_00e98190;
  auVar5 = _DAT_00e98180;
  auVar4 = _DAT_00e98170;
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar11 = (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
    uVar8 = lVar11 - 4;
    auVar18._8_4_ = (int)uVar8;
    auVar18._0_8_ = uVar8;
    auVar18._12_4_ = (int)(uVar8 >> 0x20);
    auVar15._0_8_ = uVar8 >> 2;
    auVar15._8_8_ = auVar18._8_8_ >> 2;
    in_RCX = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)0x0;
    auVar15 = auVar15 ^ _DAT_00e98190;
    do {
      uVar10 = (uint)in_RCX;
      auVar17._8_4_ = uVar10;
      auVar17._0_8_ = in_RCX;
      auVar17._12_4_ = (int)((ulong)in_RCX >> 0x20);
      auVar18 = (auVar17 | auVar5) ^ auVar6;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[(long)in_RCX] = uVar10;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)((long)&(in_RCX->entries).
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1)] = uVar10 + 1;
      }
      auVar18 = (auVar17 | auVar4) ^ auVar6;
      iVar19 = auVar18._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar18._0_4_ <= auVar15._0_4_)) {
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)((long)&(in_RCX->entries).
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 2)] = uVar10 + 2;
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(long)((long)&(in_RCX->entries).
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 3)] = uVar10 + 3;
      }
      in_RCX = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
               ((long)&(in_RCX->entries).
                       super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                       ._M_impl.super__Vector_impl_data._M_start + 4);
    } while ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             ((uVar8 >> 2) + 4 & 0xfffffffffffffffc) != in_RCX);
    if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar3 = 0x3f;
      if (lVar11 >> 2 != 0) {
        for (; (ulong)(lVar11 >> 2) >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      in_RCX = depgraph;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                  )depgraph);
      if (lVar11 < 0x41) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first,
                   (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                             )depgraph);
      }
      else {
        __last_00._M_current = __first + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                  ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    )__first,__last_00,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                    )depgraph);
        for (; __last_00._M_current != __last; __last_00._M_current = __last_00._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Val_comp_iter<(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_achow101[P]bitcoin_src_test_util_cluster_linearize_h:130:57)>
                      )depgraph);
        }
      }
    }
  }
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&local_68,
             ((long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(depgraph->entries).
                    super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    pDVar13 = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)0x0;
    uVar10 = 0xffffffff;
    do {
      local_6c = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[(long)pDVar13];
      WriteVarInt<VectorWriter,(VarIntMode)1,int>
                (s,(depgraph->entries).
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start[local_6c].feerate.size);
      uVar8 = (depgraph->entries).
              super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
              ._M_impl.super__Vector_impl_data._M_start[local_6c].feerate.fee;
      uVar12 = ~uVar8 * 2 + 1;
      if (-1 < (long)uVar8) {
        uVar12 = uVar8 * 2;
      }
      WriteVarInt<VectorWriter,(VarIntMode)0,unsigned_long>(s,uVar12);
      if (pDVar13 == (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)0x0) {
        uVar12 = 0;
      }
      else {
        uVar7 = 0;
        uVar12 = 0;
        pDVar14 = pDVar13;
        uVar9 = uVar10;
        do {
          uVar1 = local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9];
          pEVar2 = (depgraph->entries).
                   super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((pEVar2[uVar1].descendants.m_val & uVar7) == 0) {
            if ((pEVar2[local_6c].ancestors.m_val >> (uVar1 & 0x1f) & 1) == 0) {
              uVar12 = uVar12 + 1;
            }
            else {
              WriteVarInt<VectorWriter,(VarIntMode)0,unsigned_long>(s,uVar12);
              uVar7 = uVar7 | 1 << ((byte)uVar1 & 0x1f);
              uVar12 = 0;
            }
          }
          uVar9 = uVar9 - 1;
          pDVar14 = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                    ((long)&pDVar14[-1].entries.
                            super__Vector_base<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry,_std::allocator<cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Entry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        } while (pDVar14 != (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)0x0);
      }
      if ((long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
        uVar8 = 0;
      }
      else {
        uVar9 = 1;
        uVar8 = 0;
        do {
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1 - uVar8] < local_6c) break;
          uVar8 = (ulong)uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar8 < (ulong)((long)local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_68.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 2));
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                (&local_68,
                 (const_iterator)
                 (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -uVar8),&local_6c);
      WriteVarInt<VectorWriter,(VarIntMode)0,unsigned_long>(s,uVar8 + uVar12);
      pDVar13 = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)(ulong)((int)pDVar13 + 1);
      in_RCX = (DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
               ((long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 2);
      uVar10 = uVar10 + 1;
    } while (pDVar13 < in_RCX);
  }
  local_6c = local_6c & 0xffffff00;
  VectorWriter::write(s,(int)&local_6c,(void *)0x1,(size_t)in_RCX);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Ser(Stream& s, const DepGraph<SetType>& depgraph)
    {
        /** Construct a topological order to serialize the transactions in. */
        std::vector<ClusterIndex> topo_order(depgraph.TxCount());
        std::iota(topo_order.begin(), topo_order.end(), ClusterIndex{0});
        std::sort(topo_order.begin(), topo_order.end(), [&](ClusterIndex a, ClusterIndex b) {
            auto anc_a = depgraph.Ancestors(a).Count(), anc_b = depgraph.Ancestors(b).Count();
            if (anc_a != anc_b) return anc_a < anc_b;
            return a < b;
        });

        /** Which transactions the deserializer already knows when it has deserialized what has
         *  been serialized here so far, and in what order. */
        std::vector<ClusterIndex> rebuilt_order;
        rebuilt_order.reserve(depgraph.TxCount());

        // Loop over the transactions in topological order.
        for (ClusterIndex topo_idx = 0; topo_idx < topo_order.size(); ++topo_idx) {
            /** Which depgraph index we are currently writing. */
            ClusterIndex idx = topo_order[topo_idx];
            // Write size, which must be larger than 0.
            s << VARINT_MODE(depgraph.FeeRate(idx).size, VarIntMode::NONNEGATIVE_SIGNED);
            // Write fee, encoded as an unsigned varint (odd=negative, even=non-negative).
            s << VARINT(SignedToUnsigned(depgraph.FeeRate(idx).fee));
            // Write dependency information.
            SetType written_parents;
            uint64_t diff = 0; //!< How many potential parent/child relations we have skipped over.
            for (ClusterIndex dep_dist = 0; dep_dist < topo_idx; ++dep_dist) {
                /** Which depgraph index we are currently considering as parent of idx. */
                ClusterIndex dep_idx = topo_order[topo_idx - 1 - dep_dist];
                // Ignore transactions which are already known to be ancestors.
                if (depgraph.Descendants(dep_idx).Overlaps(written_parents)) continue;
                if (depgraph.Ancestors(idx)[dep_idx]) {
                    // When an actual parent is encountered, encode how many non-parents were skipped
                    // before it.
                    s << VARINT(diff);
                    diff = 0;
                    written_parents.Set(dep_idx);
                } else {
                    // When a non-parent is encountered, increment the skip counter.
                    ++diff;
                }
            }
            // Write position information.
            ClusterIndex insert_distance = 0;
            while (insert_distance < rebuilt_order.size()) {
                // Loop to find how far from the end in rebuilt_order to insert.
                if (idx > *(rebuilt_order.end() - 1 - insert_distance)) break;
                ++insert_distance;
            }
            rebuilt_order.insert(rebuilt_order.end() - insert_distance, idx);
            s << VARINT(diff + insert_distance);
        }

        // Output a final 0 to denote the end of the graph.
        s << uint8_t{0};
    }